

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall
cmComputeLinkDepends::AddVarLinkEntries(cmComputeLinkDepends *this,int depender_index,char *value)

{
  cmTarget *pcVar1;
  pointer pcVar2;
  int iVar3;
  char *__s1;
  cmTarget *pcVar4;
  LinkLibraryType LVar5;
  bool bVar6;
  bool bVar7;
  pointer name;
  string var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> actual_libs;
  value_type local_a8;
  long local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> local_58;
  _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
  *local_38;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_a8,value,(allocator *)&local_58);
  cmSystemTools::ExpandListArgument(&local_a8.super_string,&local_78,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.super_string._M_dataplus._M_p != &local_a8.super_string.field_2) {
    operator_delete(local_a8.super_string._M_dataplus._M_p,
                    local_a8.super_string.field_2._M_allocated_capacity + 1);
  }
  local_58.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_38 = (_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                *)&this->OldWrongConfigItems;
    bVar7 = false;
    local_80 = (ulong)(uint)depender_index * 0x30;
    LVar5 = GENERAL;
    name = local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar3 = std::__cxx11::string::compare((char *)name);
      bVar6 = true;
      if (iVar3 == 0) {
        LVar5 = DEBUG;
        bVar7 = bVar6;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)name);
        if (iVar3 == 0) {
          LVar5 = OPTIMIZED;
          bVar7 = bVar6;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)name);
          if (iVar3 == 0) {
            LVar5 = GENERAL;
            bVar7 = bVar6;
          }
          else if (name->_M_string_length != 0) {
            if (!bVar7) {
              local_a8.super_string._M_dataplus._M_p = (pointer)&local_a8.super_string.field_2;
              pcVar2 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,pcVar2,pcVar2 + name->_M_string_length);
              std::__cxx11::string::append((char *)&local_a8);
              __s1 = cmMakefile::GetDefinition(this->Makefile,&local_a8.super_string);
              if (__s1 != (char *)0x0) {
                iVar3 = strcmp(__s1,"debug");
                if (iVar3 == 0) {
                  LVar5 = DEBUG;
                }
                else {
                  iVar3 = strcmp(__s1,"optimized");
                  if (iVar3 == 0) {
                    LVar5 = OPTIMIZED;
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8.super_string._M_dataplus._M_p != &local_a8.super_string.field_2) {
                operator_delete(local_a8.super_string._M_dataplus._M_p,
                                local_a8.super_string.field_2._M_allocated_capacity + 1);
              }
            }
            if ((LVar5 == GENERAL) || (LVar5 == this->LinkType)) {
              pcVar4 = this->Target;
              if ((-1 < depender_index) &&
                 (pcVar1 = *(cmTarget **)
                            ((long)&((this->EntryList).
                                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->Target + local_80),
                 pcVar1 != (cmTarget *)0x0)) {
                pcVar4 = pcVar1;
              }
              pcVar4 = cmTarget::FindTargetToLink(pcVar4,name);
              local_a8.super_string._M_dataplus._M_p = (pointer)&local_a8.super_string.field_2;
              pcVar2 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,pcVar2,pcVar2 + name->_M_string_length);
              local_a8.Target = pcVar4;
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back(&local_58,&local_a8);
            }
            else {
              LVar5 = GENERAL;
              bVar7 = false;
              if (this->OldLinkDirMode != true) goto LAB_0041a40f;
              pcVar4 = this->Target;
              if ((-1 < depender_index) &&
                 (pcVar1 = *(cmTarget **)
                            ((long)&((this->EntryList).
                                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->Target + local_80),
                 pcVar1 != (cmTarget *)0x0)) {
                pcVar4 = pcVar1;
              }
              pcVar4 = cmTarget::FindTargetToLink(pcVar4,name);
              local_a8.super_string._M_dataplus._M_p = (pointer)&local_a8.super_string.field_2;
              pcVar2 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,pcVar2,pcVar2 + name->_M_string_length);
              local_a8.Target = pcVar4;
              if (((pcVar4 != (cmTarget *)0x0) && (this->OldLinkDirMode != false)) &&
                 (pcVar4->IsImportedTarget == false)) {
                std::
                _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                ::_M_insert_unique<cmTarget_const*const&>(local_38,&local_a8.Target);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8.super_string._M_dataplus._M_p != &local_a8.super_string.field_2) {
              operator_delete(local_a8.super_string._M_dataplus._M_p,
                              local_a8.super_string.field_2._M_allocated_capacity + 1);
            }
            LVar5 = GENERAL;
            bVar7 = false;
          }
        }
      }
LAB_0041a40f:
      name = name + 1;
    } while (name != local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  AddLinkEntries<cmLinkItem>(this,depender_index,&local_58);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void cmComputeLinkDepends::AddVarLinkEntries(int depender_index,
                                             const char* value)
{
  // This is called to add the dependencies named by
  // <item>_LIB_DEPENDS.  The variable contains a semicolon-separated
  // list.  The list contains link-type;item pairs and just items.
  std::vector<std::string> deplist;
  cmSystemTools::ExpandListArgument(value, deplist);

  // Look for entries meant for this configuration.
  std::vector<cmLinkItem> actual_libs;
  cmTarget::LinkLibraryType llt = cmTarget::GENERAL;
  bool haveLLT = false;
  for(std::vector<std::string>::const_iterator di = deplist.begin();
      di != deplist.end(); ++di)
    {
    if(*di == "debug")
      {
      llt = cmTarget::DEBUG;
      haveLLT = true;
      }
    else if(*di == "optimized")
      {
      llt = cmTarget::OPTIMIZED;
      haveLLT = true;
      }
    else if(*di == "general")
      {
      llt = cmTarget::GENERAL;
      haveLLT = true;
      }
    else if(!di->empty())
      {
      // If no explicit link type was given prior to this entry then
      // check if the entry has its own link type variable.  This is
      // needed for compatibility with dependency files generated by
      // the export_library_dependencies command from CMake 2.4 and
      // lower.
      if(!haveLLT)
        {
        std::string var = *di;
        var += "_LINK_TYPE";
        if(const char* val = this->Makefile->GetDefinition(var))
          {
          if(strcmp(val, "debug") == 0)
            {
            llt = cmTarget::DEBUG;
            }
          else if(strcmp(val, "optimized") == 0)
            {
            llt = cmTarget::OPTIMIZED;
            }
          }
        }

      // If the library is meant for this link type then use it.
      if(llt == cmTarget::GENERAL || llt == this->LinkType)
        {
        cmLinkItem item(*di, this->FindTargetToLink(depender_index, *di));
        actual_libs.push_back(item);
        }
      else if(this->OldLinkDirMode)
        {
        cmLinkItem item(*di, this->FindTargetToLink(depender_index, *di));
        this->CheckWrongConfigItem(item);
        }

      // Reset the link type until another explicit type is given.
      llt = cmTarget::GENERAL;
      haveLLT = false;
      }
    }

  // Add the entries from this list.
  this->AddLinkEntries(depender_index, actual_libs);
}